

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

err_t bignParamsGen(bign_params *params,bign_pgen_calc_q calc_q,bign_pgen_on_seed on_seed,
                   void *state)

{
  bool_t bVar1;
  int iVar2;
  err_t eVar3;
  ulong count;
  word *r;
  word *b_00;
  size_t sVar4;
  u64 *b_01;
  undefined8 in_RCX;
  code *in_RDX;
  code *in_RSI;
  long *in_RDI;
  void *stack;
  octet *hash_state;
  octet *seed;
  word *yG;
  word *q;
  word *b;
  word *a;
  word *p;
  void *st;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff58;
  u64 *in_stack_ffffffffffffff60;
  word *in_stack_ffffffffffffff68;
  word *p_00;
  size_t in_stack_ffffffffffffff80;
  word *a_00;
  word *q_00;
  word *a_01;
  word *a_02;
  word *c;
  word *b_02;
  word *a_03;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if ((bVar1 == 0) || (in_RSI == (code *)0x0)) {
    local_4 = 0x6d;
  }
  else if (((*in_RDI == 0x80) || (*in_RDI == 0xc0)) || (*in_RDI == 0x100)) {
    count = *in_RDI * 2 + 7U >> 3;
    r = (word *)(*in_RDI * 2 + 0x3fU >> 6);
    if (((((uint)*(byte *)(in_RDI + 1) % 4 == 3) && (0x7f < *(byte *)((long)in_RDI + count + 7))) &&
        ((bVar1 = memIsZero(in_RDI + 9,count), bVar1 == 0 &&
         ((iVar2 = memCmpRev(in_RDI + 9,in_RDI + 1,count), iVar2 < 0 &&
          (bVar1 = memIsZero((void *)((long)in_RDI + count + 8),0x40 - count), bVar1 != 0)))))) &&
       (bVar1 = memIsZero((void *)((long)in_RDI + count + 0x48),0x40 - count), bVar1 != 0)) {
      bignParamsGen_deep(in_stack_ffffffffffffff80);
      b_00 = (word *)blobCreate((size_t)in_stack_ffffffffffffff58);
      if (b_00 == (word *)0x0) {
        local_4 = 0x6e;
      }
      else {
        b_02 = b_00 + (long)r;
        c = b_02 + (long)r;
        a_01 = c + (long)r;
        q_00 = a_01 + (long)r;
        p_00 = q_00 + 1;
        a_00 = p_00;
        a_02 = a_01;
        a_03 = b_00;
        sVar4 = beltHash_keep();
        b_01 = (u64 *)((long)p_00 + sVar4);
        u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x146700);
        bVar1 = priIsPrime(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                           (void *)0x146714);
        if (bVar1 == 0) {
          blobClose((blob_t)0x146723);
          local_4 = 0x1f6;
        }
        else {
          u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14674e);
          memCopy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14676c);
          do {
            do {
              do {
                memCopy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14678a);
                if ((in_RDX != (code *)0x0) && (eVar3 = (*in_RDX)(in_RDI,in_RCX), eVar3 != 0)) {
                  blobClose((blob_t)0x1467c4);
                  return eVar3;
                }
                beltHashStart(in_stack_ffffffffffffff60);
                beltHashStepH(p_00,(size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
                beltHashStepH(p_00,(size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
                in_stack_ffffffffffffff68 = a_00;
                in_stack_ffffffffffffff60 = b_01;
                b_01 = in_stack_ffffffffffffff60;
                a_00 = in_stack_ffffffffffffff68;
                beltHash_keep();
                memCopy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x146843);
                beltHashStepH(p_00,(size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
                bignSeedInc((octet *)q_00);
                beltHashStepH(p_00,(size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
                beltHashStepG((octet *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
                beltHashStepG((octet *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
                u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x1468b5);
                zzMod(r,a_03,(size_t)b_00,b_02,(size_t)c,a_02);
                bVar1 = ecpDetIsZero(a_00,b_01,p_00,(size_t)in_stack_ffffffffffffff68,
                                     in_stack_ffffffffffffff60);
              } while ((bVar1 != 0) ||
                      (iVar2 = zzJacobi(a_01,(size_t)q_00,a_00,(size_t)b_01,p_00), iVar2 != 1));
              u64To(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,(u64 *)0x146941);
              memSet(in_stack_ffffffffffffff60,(octet)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                     0x146966);
              eVar3 = (*in_RSI)(in_RDI,in_RCX);
            } while (eVar3 == 0x76);
            if (eVar3 != 0) {
              blobClose((blob_t)0x1469a1);
              return eVar3;
            }
            u64From(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x1469cf);
            sVar4 = wwBitSize(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
          } while ((((sVar4 != *in_RDI * 2) || (bVar1 = wwEq(a_02,b_00,(size_t)r), bVar1 != 0)) ||
                   (bVar1 = priIsPrime(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                                       (void *)0x146a1e), bVar1 == 0)) ||
                  (bVar1 = ecpMOVIsMet(q_00,a_00,(size_t)b_01,(size_t)p_00,in_stack_ffffffffffffff68
                                      ), bVar1 == 0));
          memSet(in_stack_ffffffffffffff60,(octet)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                 0x146a72);
          wwCopy(b_02,b_00,(size_t)r);
          zzAddW2(b_02,(size_t)r,1);
          wwShLo(p_00,(size_t)in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
          zzPowerMod(c,a_02,(size_t)a_01,q_00,(size_t)a_00,b_01,b_00);
          u64To(in_stack_ffffffffffffff60,(size_t)b_01,(u64 *)0x146af8);
          memSet(in_stack_ffffffffffffff60,(octet)((ulong)b_01 >> 0x38),0x146b1d);
          blobClose((blob_t)0x146b27);
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = 0x1f6;
    }
  }
  else {
    local_4 = 0x1f6;
  }
  return local_4;
}

Assistant:

err_t bignParamsGen(bign_params* params, bign_pgen_calc_q calc_q,
	bign_pgen_on_seed on_seed, void* state)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* st;
	word* p;				/* [n] */
	word* a;				/* [n] */
	word* b;				/* [W_OF_B(512)] B / [n] b */
	word* q;				/* [n] */
	word* yG;				/* [n] */
	octet* seed;			/* [8] */
	octet* hash_state;		/* [beltHash_keep] */
	void* stack;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) || 
		!calc_q)
		return ERR_BAD_INPUT;
	// проверить уровень стойкости
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	// размерности
	no = O_OF_B(2 * params->l);
	n = W_OF_B(2 * params->l);
	// проверить params:
	// - p -- 2l-битовое число?
	// - p mod 4 == 3?
	// - 0 < a < p?
	// - неиспользуемые октеты p и a обнулены?
	if (params->p[0] % 4 != 3 || params->p[no - 1] < 128 ||
		memIsZero(params->a, no) ||
		memCmpRev(params->a, params->p, no) >= 0 ||
		!memIsZero(params->p + no, sizeof(params->p) - no) ||
		!memIsZero(params->a + no, sizeof(params->a) - no))
		return ERR_BAD_PARAMS;
	// создать состояние
	st = blobCreate(bignParamsGen_deep(n));
	if (st == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	p = (word*)st;
	a = p + n;
	b = a + n;
	q = yG = b + n;
	seed = (octet*)(q + n);
	hash_state = seed + 8;
	stack = hash_state + beltHash_keep();
	ASSERT((octet*)b + 64 <= seed);
	// загрузить и проверить p
	wwFrom(p, params->p, no);
	ASSERT(wwBitSize(p, n) == params->l * 2);
	ASSERT(wwGetBits(p, 0, 2) == 3);
	if (!priIsPrime(p, n, stack))
	{
		blobClose(st);
		return ERR_BAD_PARAMS;
	}
	// загрузить a
	wwFrom(a, params->a, no);
	ASSERT(!wwIsZero(a, n));
	ASSERT(wwCmp(a, p, n) < 0);
	// загрузить seed
	memCopy(seed, params->seed, 8);
	// цикл генерации
	while (1)
	{
		// обработать seed
		memCopy(params->seed, seed, 8);
		if (on_seed)
		{
			code = on_seed(params, state);
			ERR_CALL_HANDLE(code, blobClose(st));
		}
		// belt-hash(p || a ||..)
		beltHashStart(hash_state);
		beltHashStepH(params->p, no, hash_state);
		beltHashStepH(params->a, no, hash_state);
		memCopy(stack, hash_state, beltHash_keep());
		// belt-hash(..seed)
		beltHashStepH(params->seed, 8, hash_state);
		// belt-hash(..seed + 1)
		bignSeedInc(seed);
		beltHashStepH(seed, 8, stack);
		// B <- belt-hash(p || a || seed) || belt-hash(p || a || seed + 1)
		beltHashStepG((octet*)b, hash_state);
		beltHashStepG((octet*)b + 32, stack);
		// b <- B \mod p
		wwFrom(b, b, 64);
		zzMod(b, b, W_OF_O(64), p, n, stack);
		// проверить b
		if (ecpDetIsZero(a, b, p, n, stack) ||
			zzJacobi(b, n, p, n, stack) != 1)
			continue;
		// сохранить b
		wwTo(params->b, no, b);
		memSetZero(params->b + no, sizeof(params->b) - no);
		// вычиcлить q
		code = calc_q(params, state);
		if (code == ERR_NO_RESULT)
			continue;
		ERR_CALL_HANDLE(code, blobClose(st));
		// загрузить и проверить q
		wwFrom(q, params->q, no);
		if (wwBitSize(q, n) == params->l * 2 &&
			!wwEq(q, p, n) &&
			priIsPrime(q, n, stack) &&
			ecpMOVIsMet(q, p, n, 50, stack))
			break;
	}
	// сохранить q
	memSetZero(params->q + no, sizeof(params->q) - no);
	// вычислить yG = b^{(p + 1) / 4} mod p
	wwCopy(a, p, n);
	zzAddW2(a, n, 1);
	ASSERT(!wwIsZero(a, n));
	wwShLo(a, n, 2);
	zzPowerMod(yG, b, n, a, n, p, stack);
	// сохранить yG
	wwTo(params->yG, no, yG);
	memSetZero(params->yG + no, sizeof(params->yG) - no);
	// завершение
	blobClose(st);
	return code;
}